

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

parasail_matrix_t *
parasail_matrix_create_internal(char *alphabet,int match,int mismatch,int case_sensitive)

{
  long lVar1;
  byte bVar2;
  __int32_t *p_Var3;
  __int32_t *p_Var4;
  size_t i;
  size_t __n;
  int *piVar5;
  int *piVar6;
  __int32_t **pp_Var7;
  char *__dest;
  parasail_matrix_t *ppVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  size_t sVar14;
  
  if (alphabet == (char *)0x0) {
    parasail_matrix_create_internal_cold_4();
  }
  else {
    __n = strlen(alphabet);
    if (__n < 0x7fffffff) {
      lVar1 = __n + 1;
      sVar14 = lVar1 * lVar1 * 4;
      piVar5 = (int *)malloc(sVar14);
      if (piVar5 == (int *)0x0) {
LAB_004b311c:
        fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_create_internal",sVar14)
        ;
        return (parasail_matrix_t *)0x0;
      }
      if (__n == 0) {
        lVar10 = 0;
      }
      else {
        sVar14 = 0;
        lVar11 = 0;
        do {
          lVar12 = 0;
          lVar10 = lVar11 * 4 + 4;
          do {
            lVar9 = lVar10;
            iVar13 = mismatch;
            if (sVar14 + lVar12 == 0) {
              iVar13 = match;
            }
            *(int *)((long)piVar5 + lVar9 + -4) = iVar13;
            lVar10 = lVar9 + 4;
            lVar12 = lVar12 + -1;
          } while (__n + lVar12 != 0);
          lVar11 = (lVar11 - lVar12) + 1;
          *(undefined4 *)((long)piVar5 + lVar9) = 0;
          sVar14 = sVar14 + 1;
        } while (sVar14 != __n);
      }
      memset((void *)((long)piVar5 + lVar10),0,__n * 4 + 4);
      piVar6 = (int *)malloc(0x400);
      if (piVar6 == (int *)0x0) {
        parasail_matrix_create_internal_cold_2();
      }
      else {
        lVar10 = 0;
        do {
          piVar6[lVar10] = (int)__n;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x100);
        if (case_sensitive == 0) {
          if (__n != 0) {
            pp_Var7 = __ctype_toupper_loc();
            p_Var3 = *pp_Var7;
            pp_Var7 = __ctype_tolower_loc();
            p_Var4 = *pp_Var7;
            sVar14 = 0;
            do {
              bVar2 = alphabet[sVar14];
              piVar6[p_Var3[bVar2]] = (int)sVar14;
              piVar6[p_Var4[bVar2]] = (int)sVar14;
              sVar14 = sVar14 + 1;
            } while (__n != sVar14);
          }
        }
        else if (__n != 0) {
          sVar14 = 0;
          do {
            piVar6[(byte)alphabet[sVar14]] = (int)sVar14;
            sVar14 = sVar14 + 1;
          } while (__n != sVar14);
        }
        sVar14 = __n + 2;
        __dest = (char *)malloc(sVar14);
        if (__dest == (char *)0x0) goto LAB_004b311c;
        memcpy(__dest,alphabet,__n);
        (__dest + __n)[0] = '*';
        (__dest + __n)[1] = '\0';
        ppVar8 = (parasail_matrix_t *)malloc(0x48);
        if (ppVar8 != (parasail_matrix_t *)0x0) {
          ppVar8->name = "";
          ppVar8->matrix = piVar5;
          ppVar8->mapper = piVar6;
          ppVar8->size = (int)lVar1;
          iVar13 = mismatch;
          if (mismatch < match) {
            iVar13 = match;
          }
          ppVar8->max = iVar13;
          if (match < mismatch) {
            mismatch = match;
          }
          ppVar8->min = mismatch;
          ppVar8->user_matrix = piVar5;
          ppVar8->type = 0;
          ppVar8->length = (int)lVar1;
          ppVar8->alphabet = __dest;
          ppVar8->query = (char *)0x0;
          return ppVar8;
        }
        parasail_matrix_create_internal_cold_1();
      }
    }
    else {
      parasail_matrix_create_internal_cold_3();
    }
  }
  return (parasail_matrix_t *)0x0;
}

Assistant:

static parasail_matrix_t* parasail_matrix_create_internal(
        const char *alphabet, const int match, const int mismatch, int case_sensitive)
{
    parasail_matrix_t *retval = NULL;
    int *matrix = NULL;
    int *mapper = NULL;
    char *alphabet_copy = NULL;
    size_t size = 0;
    size_t size1 = 0;
    size_t i = 0;
    size_t j = 0;
    size_t c = 0;

    PARASAIL_CHECK_NULL(alphabet);

    size = strlen(alphabet);
    if (size >= INT_MAX) {
        fprintf(stderr, "%s: alphabet is too large\n", __func__);
        return NULL;
    }
    size1 = size + 1;

    PARASAIL_CALLOC(matrix, int, size1*size1);

    for (i=0; i<size; ++i) {
        for (j=0; j<size; ++j) {
            if (i == j) {
                matrix[c++] = match;
            }
            else {
                matrix[c++] = mismatch;
            }
        }
        matrix[c++] = 0;
    }
    for (j=0; j<size1; ++j) {
        matrix[c++] = 0;
    }

    PARASAIL_CALLOC(mapper, int, 256);
    parasail_memset_int(mapper, (int)size, 256);
    if (case_sensitive) {
        for (i=0; i<size; ++i) {
            mapper[(unsigned char)alphabet[i]] = (int)i;
        }
    }
    else {
        for (i=0; i<size; ++i) {
            mapper[toupper((unsigned char)alphabet[i])] = (int)i;
            mapper[tolower((unsigned char)alphabet[i])] = (int)i;
        }
    }

    PARASAIL_CALLOC(alphabet_copy, char, size1+1);
    (void)memcpy(alphabet_copy, alphabet, sizeof(char) * size);
    alphabet_copy[size] = '*';
    alphabet_copy[size1] = '\0';

    PARASAIL_NEW(retval, parasail_matrix_t);
    retval->name = "";
    retval->matrix = matrix;
    retval->mapper = mapper;
    retval->size = (int)size1;
    retval->max = match > mismatch ? match : mismatch;
    retval->min = match > mismatch ? mismatch : match;
    retval->user_matrix = matrix;
    retval->type = PARASAIL_MATRIX_TYPE_SQUARE;
    retval->length = retval->size;
    retval->alphabet = alphabet_copy;
    retval->query = NULL;
    return retval;
}